

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O0

bool __thiscall
sptk::ScalarOperation::Run(ScalarOperation *this,double *number,bool *is_magic_number)

{
  bool bVar1;
  uint uVar2;
  const_iterator __lhs;
  reference ppMVar3;
  undefined1 *in_RDX;
  long in_RSI;
  vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
  *in_RDI;
  const_iterator itr;
  __normal_iterator<sptk::ScalarOperation::ModuleInterface_*const_*,_std::vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>_>
  local_28;
  undefined1 *local_20;
  long local_18;
  bool local_1;
  
  if ((in_RSI == 0) || (in_RDX == (undefined1 *)0x0)) {
    local_1 = false;
  }
  else {
    *in_RDX = 0;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_28._M_current =
         (ModuleInterface **)
         std::
         vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
         ::begin(in_RDI);
    while( true ) {
      __lhs = std::
              vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
              ::end(in_RDI);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<sptk::ScalarOperation::ModuleInterface_*const_*,_std::vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>_>
                          *)__lhs._M_current,
                         (__normal_iterator<sptk::ScalarOperation::ModuleInterface_*const_*,_std::vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>_>
                          *)in_RDI);
      if (!bVar1) break;
      ppMVar3 = __gnu_cxx::
                __normal_iterator<sptk::ScalarOperation::ModuleInterface_*const_*,_std::vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>_>
                ::operator*(&local_28);
      uVar2 = (*(*ppMVar3)->_vptr_ModuleInterface[2])(*ppMVar3,local_18,local_20);
      if ((uVar2 & 1) == 0) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<sptk::ScalarOperation::ModuleInterface_*const_*,_std::vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>_>
      ::operator++(&local_28);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ScalarOperation::Run(double* number, bool* is_magic_number) const {
  if (NULL == number || NULL == is_magic_number) {
    return false;
  }

  *is_magic_number = false;
  for (std::vector<ScalarOperation::ModuleInterface*>::const_iterator itr(
           modules_.begin());
       itr != modules_.end(); ++itr) {
    if (!(*itr)->Run(number, is_magic_number)) {
      return false;
    }
  }

  return true;
}